

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.hpp
# Opt level: O0

void __thiscall IOException::IOException(IOException *this,string *message)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RSI;
  runtime_error *in_RDI;
  string local_30 [32];
  
  std::operator+((char *)in_RDI,in_RSI);
  std::runtime_error::runtime_error(in_RDI,local_30);
  std::__cxx11::string::~string(local_30);
  *(undefined ***)in_RDI = &PTR__IOException_00107d98;
  return;
}

Assistant:

explicit IOException(const std::string& message) :
        std::runtime_error("IO Exception Raised: " + message) {}